

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

xmlHashEntry *
xmlHashFindEntry(xmlHashTable *hash,xmlChar *key,xmlChar *key2,xmlChar *key3,uint hashValue,
                int *pfound)

{
  xmlHashEntry *pxVar1;
  xmlChar *pxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  xmlHashEntry *pxVar7;
  uint uVar8;
  
  uVar8 = hash->size - 1;
  uVar5 = uVar8 & hashValue;
  pxVar1 = hash->table;
  pxVar7 = pxVar1 + uVar5;
  uVar4 = pxVar7->hashValue;
  if (uVar4 == 0) {
    iVar3 = 0;
LAB_0012e973:
    *pfound = iVar3;
    return pxVar7;
  }
  uVar6 = 0;
  do {
    uVar5 = uVar5 + 1;
    if (uVar4 == (hashValue | 0x80000000)) {
      if ((((hash->dict != (xmlDictPtr)0x0) && (pxVar7->key == key)) && (pxVar7->key2 == key2)) &&
         (pxVar7->key3 == key3)) goto LAB_0012e96a;
      iVar3 = strcmp((char *)pxVar7->key,(char *)key);
      if (iVar3 == 0) {
        pxVar2 = pxVar7->key2;
        if ((key2 == (xmlChar *)0x0) || (pxVar2 == (xmlChar *)0x0)) {
          if (pxVar2 == (xmlChar *)0x0 && key2 == (xmlChar *)0x0) goto LAB_0012e945;
        }
        else {
          iVar3 = strcmp((char *)pxVar2,(char *)key2);
          if (iVar3 == 0) {
LAB_0012e945:
            pxVar2 = pxVar7->key3;
            if ((key3 == (xmlChar *)0x0) || (pxVar2 == (xmlChar *)0x0)) {
              if (pxVar2 == (xmlChar *)0x0 && key3 == (xmlChar *)0x0) goto LAB_0012e96a;
            }
            else {
              iVar3 = strcmp((char *)pxVar2,(char *)key3);
              if (iVar3 == 0) {
LAB_0012e96a:
                iVar3 = 1;
                goto LAB_0012e973;
              }
            }
          }
        }
      }
    }
    pxVar7 = pxVar7 + 1;
    if ((uVar5 & uVar8) == 0) {
      pxVar7 = pxVar1;
    }
    uVar4 = pxVar7->hashValue;
    iVar3 = 0;
    if ((uVar4 == 0) || (uVar6 = uVar6 + 1, (uVar5 - uVar4 & uVar8) < uVar6)) goto LAB_0012e973;
  } while( true );
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlHashEntry *
xmlHashFindEntry(const xmlHashTable *hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 unsigned hashValue, int *pfound) {
    xmlHashEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if (entry->hashValue == hashValue) {
                if (hash->dict) {
                    if ((entry->key == key) &&
                        (entry->key2 == key2) &&
                        (entry->key3 == key3)) {
                        found = 1;
                        break;
                    }
                }
                if ((strcmp((const char *) entry->key,
                            (const char *) key) == 0) &&
                    (xmlFastStrEqual(entry->key2, key2)) &&
                    (xmlFastStrEqual(entry->key3, key3))) {
                    found = 1;
                    break;
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}